

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3PagerOpenSavepoint(Pager *pPager,int nSavepoint)

{
  int nSavepoint_local;
  Pager *pPager_local;
  
  if ((pPager->nSavepoint < nSavepoint) && (pPager->useJournal != '\0')) {
    pPager_local._4_4_ = pagerOpenSavepoint(pPager,nSavepoint);
  }
  else {
    pPager_local._4_4_ = 0;
  }
  return pPager_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3PagerOpenSavepoint(Pager *pPager, int nSavepoint){
  assert( pPager->eState>=PAGER_WRITER_LOCKED );
  assert( assert_pager_state(pPager) );

  if( nSavepoint>pPager->nSavepoint && pPager->useJournal ){
    return pagerOpenSavepoint(pPager, nSavepoint);
  }else{
    return SQLITE_OK;
  }
}